

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::TextureSpecCase::verifyTexCube
          (TextureSpecCase *this,GLContext *gles2Context,ReferenceContext *refContext)

{
  int iVar1;
  int iVar2;
  TestLog *log;
  char *imageSetDesc;
  int local_fc;
  CubeFace local_ec;
  string local_e8;
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined4 local_7c;
  int local_78;
  float threshold;
  undefined1 local_68 [8];
  Surface result;
  Surface reference;
  int face;
  bool isOk;
  int levelH;
  int levelW;
  int levelNdx;
  int numLevels;
  ReferenceContext *refContext_local;
  GLContext *gles2Context_local;
  TextureSpecCase *this_local;
  
  if ((this->m_flags & 1) == 0) {
    local_fc = 1;
  }
  else {
    iVar1 = deLog2Floor32(this->m_width);
    iVar2 = deLog2Floor32(this->m_height);
    local_fc = de::max<int>(iVar1,iVar2);
    local_fc = local_fc + 1;
  }
  levelH = 0;
  do {
    if (local_fc <= levelH) {
      return;
    }
    iVar1 = de::max<int>(1,this->m_width >> ((byte)levelH & 0x1f));
    iVar2 = de::max<int>(1,this->m_height >> ((byte)levelH & 0x1f));
    reference.m_pixels.m_cap._7_1_ = true;
    for (reference.m_pixels.m_cap._0_4_ = CUBEFACE_NEGATIVE_X;
        (int)(CubeFace)reference.m_pixels.m_cap < 6;
        reference.m_pixels.m_cap._0_4_ = (CubeFace)reference.m_pixels.m_cap + CUBEFACE_POSITIVE_X) {
      tcu::Surface::Surface((Surface *)&result.m_pixels.m_cap);
      tcu::Surface::Surface((Surface *)local_68);
      if ((iVar1 < 3) || (iVar2 < 3)) {
        local_78 = 7;
      }
      else {
        sglr::ContextWrapper::setContext(&this->super_ContextWrapper,&gles2Context->super_Context);
        renderTexCube(this,(Surface *)local_68,iVar1,iVar2,(CubeFace)reference.m_pixels.m_cap);
        sglr::ContextWrapper::setContext(&this->super_ContextWrapper,&refContext->super_Context);
        renderTexCube(this,(Surface *)&result.m_pixels.m_cap,iVar1,iVar2,
                      (CubeFace)reference.m_pixels.m_cap);
        local_7c = 0x3ca3d70a;
        log = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c0,"Image comparison result: ",&local_c1);
        local_ec = (CubeFace)reference.m_pixels.m_cap;
        de::toString<tcu::CubeFace>(&local_e8,&local_ec);
        std::operator+(&local_a0,&local_c0,&local_e8);
        imageSetDesc = (char *)std::__cxx11::string::c_str();
        reference.m_pixels.m_cap._7_1_ =
             tcu::fuzzyCompare(log,"Result",imageSetDesc,(Surface *)&result.m_pixels.m_cap,
                               (Surface *)local_68,0.02,COMPARE_LOG_ON_ERROR - (levelH == 0));
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_e8);
        std::__cxx11::string::~string((string *)&local_c0);
        std::allocator<char>::~allocator(&local_c1);
        if (reference.m_pixels.m_cap._7_1_) {
          local_78 = 0;
        }
        else {
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Image comparison failed");
          local_78 = 5;
        }
      }
      tcu::Surface::~Surface((Surface *)local_68);
      tcu::Surface::~Surface((Surface *)&result.m_pixels.m_cap);
      if ((local_78 != 0) && (local_78 == 5)) break;
    }
    if (reference.m_pixels.m_cap._7_1_ == false) {
      return;
    }
    levelH = levelH + 1;
  } while( true );
}

Assistant:

void TextureSpecCase::verifyTexCube (sglr::GLContext& gles2Context, sglr::ReferenceContext& refContext)
{
	int numLevels = (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;

	DE_ASSERT(m_texType == TEXTURETYPE_CUBE);

	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		int		levelW	= de::max(1, m_width >> levelNdx);
		int		levelH	= de::max(1, m_height >> levelNdx);
		bool	isOk	= true;

		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
		{
			tcu::Surface	reference;
			tcu::Surface	result;

			if (levelW <= 2 || levelH <= 2)
				continue; // Don't bother checking.

			// Render with GLES2
			setContext(&gles2Context);
			renderTexCube(result, levelW, levelH, (tcu::CubeFace)face);

			// Render reference.
			setContext(&refContext);
			renderTexCube(reference, levelW, levelH, (tcu::CubeFace)face);

			const float	threshold	= 0.02f;
			isOk = tcu::fuzzyCompare(m_testCtx.getLog(), "Result", (string("Image comparison result: ") + de::toString((tcu::CubeFace)face)).c_str(), reference, result, threshold,
									 levelNdx == 0 ? tcu::COMPARE_LOG_RESULT : tcu::COMPARE_LOG_ON_ERROR);

			if (!isOk)
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
				break;
			}
		}

		if (!isOk)
			break;
	}
}